

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O3

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::TriaO2::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,TriaO2 *this,RefinementPattern *ref_pat,dim_t codim)

{
  __uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
  _Var1;
  PointerType pdVar2;
  char *pcVar3;
  uint uVar4;
  double dVar5;
  undefined8 uVar6;
  int iVar7;
  tuple<lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_> tVar8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar9;
  runtime_error *prVar10;
  ostream *poVar11;
  ulong uVar12;
  PointerType pdVar13;
  double *pdVar14;
  long lVar15;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *childGeoPtrs;
  MatrixXd locChildPolygonCoords;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  childPolygons;
  MatrixXd locChildCoords_1;
  MatrixXd locChildCoords;
  stringstream ss;
  scalar_quotient_op<double,_double> local_681;
  vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
  *local_680;
  Matrix<double,__1,__1,_0,__1,__1> local_678;
  TriaO2 *local_660;
  undefined1 local_658 [160];
  undefined1 local_5b8 [64];
  PointerType local_578;
  long local_518;
  long local_510;
  undefined1 local_500 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0 [3];
  variable_if_dynamic<long,__1> local_4c0;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_488;
  undefined **local_470;
  ulong local_468;
  PointerType local_460;
  ulong local_458;
  ulong local_450;
  double local_448;
  scalar_constant_op<double> local_440;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_438;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_3f8;
  undefined1 local_3d8 [24];
  double local_3c0;
  XprTypeNested local_3b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_250;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_1d8;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_160;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_128;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_f0;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_b8;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_a0;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_68;
  
  local_680 = (vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
               *)__return_storage_ptr__;
  local_660 = this;
  if (ref_pat[8] != (RefinementPattern)0x3) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3d8 + 0x10),"Refinement pattern for ",0x17);
    local_658[0] = ref_pat[8];
    base::RefEl::ToString_abi_cxx11_((string *)local_5b8,(RefEl *)local_658);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3d8 + 0x10),(char *)local_5b8._0_8_,local_5b8._8_8_);
    pcVar3 = local_5b8 + 0x10;
    if ((char *)local_5b8._0_8_ != pcVar3) {
      operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
    }
    local_5b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5b8,"ref_pat.RefEl() == lf::base::RefEl::kTria()","");
    local_658._0_8_ = (long)local_658 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_5b8,(string *)local_658,0xb0,(string *)local_500);
    if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
      operator_delete((void *)local_500._0_8_,local_4f0[0]._M_allocated_capacity + 1);
    }
    if (local_658._0_8_ != (long)local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if ((char *)local_5b8._0_8_ != pcVar3) {
      operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (2 < codim) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3d8 + 0x10),"Illegal codim ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_3d8 + 0x10));
    local_5b8._0_8_ = local_5b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"codim < 3","");
    local_658._0_8_ = (long)local_658 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_5b8,(string *)local_658,0xb1,(string *)local_500);
    if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
      operator_delete((void *)local_500._0_8_,local_4f0[0]._M_allocated_capacity + 1);
    }
    if (local_658._0_8_ != (long)local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
      operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = *(uint *)(ref_pat + 0xc);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)ref_pat + 8))(&local_518,ref_pat,codim);
  lVar15 = local_510 - local_518;
  iVar7 = (*(code *)**(undefined8 **)ref_pat)(ref_pat,codim);
  local_458 = (lVar15 >> 3) * -0x5555555555555555;
  if (iVar7 != (int)local_458) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3d8 + 0x10),"NumChildren ",0xc);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)(local_3d8 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," <-> ",5);
    (*(code *)**(undefined8 **)ref_pat)(ref_pat,codim);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    local_5b8._0_8_ = local_5b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5b8,"noChildren == ref_pat.NumChildren(codim)","");
    local_658._0_8_ = (long)local_658 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_5b8,(string *)local_658,0xbd,(string *)local_500);
    if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
      operator_delete((void *)local_500._0_8_,local_4f0[0]._M_allocated_capacity + 1);
    }
    if (local_658._0_8_ != (long)local_658 + 0x10) {
      operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
    }
    if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
      operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_458 = local_458 & 0xffffffff;
  if (local_458 != 0) {
    local_460 = (PointerType)(1.0 / (double)uVar4);
    local_468 = (ulong)(3 - codim);
    uVar12 = 0;
    local_470 = &PTR_DimLocal_00455978;
    do {
      if (*(long *)(local_518 + 8 + uVar12 * 0x18) != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3d8 + 0x10),"childPolygons[child].rows() = ",0x1e);
        std::ostream::_M_insert<long>((long)(local_3d8 + 0x10));
        local_5b8._0_8_ = local_5b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5b8,"childPolygons[child].rows() == 2","");
        local_658._0_8_ = (long)local_658 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_658,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_5b8,(string *)local_658,199,(string *)local_500);
        if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
          operator_delete((void *)local_500._0_8_,local_4f0[0]._M_allocated_capacity + 1);
        }
        if (local_658._0_8_ != (long)local_658 + 0x10) {
          operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
        }
        if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
          operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"this code should not be reached");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      _Var1.
      super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>.
      _M_t.
      super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
      .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
           (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
           (local_518 + uVar12 * 0x18);
      local_450 = uVar12;
      if (*(ulong *)((long)_Var1.
                           super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                           .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl +
                    0x10) != local_468) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3d8 + 0x10),"childPolygons[child].cols() = ",0x1e);
        std::ostream::_M_insert<long>((long)(local_3d8 + 0x10));
        local_5b8._0_8_ = local_5b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5b8,"childPolygons[child].cols() == (3 - codim)","");
        local_658._0_8_ = (long)local_658 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_658,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_5b8,(string *)local_658,0xca,(string *)local_500);
        if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
          operator_delete((void *)local_500._0_8_,local_4f0[0]._M_allocated_capacity + 1);
        }
        if (local_658._0_8_ != (long)local_658 + 0x10) {
          operator_delete((void *)local_658._0_8_,local_658._16_8_ + 1);
        }
        if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
          operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"this code should not be reached");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_500._0_8_ = local_460;
      local_658._0_8_ =
           _Var1.
           super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
           ._M_t.
           super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
           .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)local_5b8,2,local_468,(scalar_constant_op<double> *)local_500);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                       *)local_3d8,(Lhs *)local_5b8,(Rhs *)local_658,
                      (scalar_product_op<double,_double> *)&local_250);
      local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      local_448 = local_3c0;
      pdVar14 = (local_3b8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_data;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>,double,double>
                (&local_678,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                  *)local_3d8,(assign_op<double,_double> *)local_5b8);
      if (0 < local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols * local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows) {
        lVar15 = 0;
        do {
          local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[lVar15] = (double)*(int *)((long)pdVar14 + lVar15 * 4) * local_448;
          lVar15 = lVar15 + 1;
        } while (local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols *
                 local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows - lVar15 != 0);
      }
      if (codim == 0) {
        local_488.m_storage.m_data = (PointerType)0x0;
        local_488.m_storage.m_rows = 0;
        local_488.m_storage.m_cols = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                  (&local_488,
                   local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows,6);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_3f8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_488,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_678);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  (&local_438,&local_678,0);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  (&local_f0,&local_678,1);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                         *)local_500,&local_438,&local_f0,(scalar_sum_op<double,_double> *)local_5b8
                       );
        local_658._0_8_ = &DAT_4000000000000000;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          *)local_5b8,local_4c0.m_value,1,(scalar_constant_op<double> *)local_658);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_3d8,
                        (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                         *)local_500,(Rhs *)local_5b8,
                        (scalar_quotient_op<double,_double> *)&local_250);
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_3f8,
                            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                             *)local_3d8);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  (&local_128,&local_678,1);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  (&local_68,&local_678,2);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
        ::CwiseBinaryOp(&local_250,&local_128,&local_68,(scalar_sum_op<double,_double> *)local_658);
        local_1d8.m_lhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        m_data = (PointerType)0x4000000000000000;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          *)local_658,
                         local_250.m_rhs.
                         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                         .
                         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                         .m_rows.m_value,1,(scalar_constant_op<double> *)&local_1d8);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_5b8,&local_250,(Rhs *)local_658,
                        (scalar_quotient_op<double,_double> *)&local_160);
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar9,
                            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                             *)local_5b8);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  (&local_160,&local_678,2);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  (&local_a0,&local_678,0);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
        ::CwiseBinaryOp(&local_1d8,&local_160,&local_a0,(scalar_sum_op<double,_double> *)&local_b8);
        local_440.m_other = 2.0;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
        ::CwiseNullaryOp(&local_b8,
                         local_1d8.m_rhs.
                         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                         .
                         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                         .m_rows.m_value,1,&local_440);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_658,&local_1d8,&local_b8,&local_681);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar9,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)local_658);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(&local_3f8);
        (*(local_660->super_Geometry)._vptr_Geometry[3])
                  ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_3d8,local_660,&local_488);
        std::make_unique<lf::geometry::TriaO2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_658);
        local_5b8._0_8_ = local_658._0_8_;
        local_658._0_8_ = (XprTypeNested)0x0;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  (local_680,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_5b8);
        if ((_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             )local_5b8._0_8_ != (Geometry *)0x0) {
          (**(code **)(*(long *)local_5b8._0_8_ + 0x58))();
        }
        local_5b8._0_8_ = (char *)0x0;
        if ((_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             )local_658._0_8_ != (Geometry *)0x0) {
          (**(code **)(*(long *)local_658._0_8_ + 0x58))();
        }
        local_658._0_8_ = (Geometry *)0x0;
        free((void *)local_3d8._0_8_);
        pdVar14 = local_488.m_storage.m_data;
      }
      else if (codim == 1) {
        local_438.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        m_data = (PointerType)0x0;
        local_438.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        m_rows.m_value = 0;
        local_438.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        _16_8_ = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_438,
                   local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows,3);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_250,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_438,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_678);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_658,
                   &local_678,0);
        Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_500,
                   &local_678,1);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                         *)local_5b8,(Lhs *)local_658,(Rhs *)local_500,
                        (scalar_sum_op<double,_double> *)&local_1d8);
        local_f0.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        m_data = (PointerType)0x4000000000000000;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          *)&local_1d8,(Index)local_578,1,(scalar_constant_op<double> *)&local_f0);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_3d8,(Lhs *)local_5b8,(Rhs *)&local_1d8,
                        (scalar_quotient_op<double,_double> *)&local_128);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_250,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)local_3d8);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                  ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_250);
        (*(local_660->super_Geometry)._vptr_Geometry[3])
                  ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_3d8,local_660,&local_438);
        tVar8.
        super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
        .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
              )operator_new(0x60);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
        PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_5b8,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3d8);
        SegmentO2::SegmentO2
                  ((SegmentO2 *)
                   tVar8.
                   super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                   .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl,
                   (Matrix<double,__1,_3,_0,__1,_3> *)local_5b8);
        free((void *)local_5b8._0_8_);
        local_658._0_8_ =
             tVar8.
             super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  (local_680,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_658);
        if ((_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             )local_658._0_8_ != (Geometry *)0x0) {
          (**(code **)(*(long *)local_658._0_8_ + 0x58))();
        }
        local_658._0_8_ =
             (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
             0x0;
        free((void *)local_3d8._0_8_);
        pdVar14 = local_438.
                  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_data;
      }
      else {
        (*(local_660->super_Geometry)._vptr_Geometry[3])
                  ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_3d8,local_660,&local_678);
        tVar8.
        super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
        .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
              )operator_new(0x18);
        local_5b8._0_8_ = (char *)0x0;
        local_5b8._8_8_ = (PointerType)0x0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_5b8,
                   (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3d8);
        uVar6 = local_3d8._0_8_;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_5b8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)local_3d8,
                   (assign_op<double,_double> *)local_500);
        pdVar13 = (PointerType)
                  (local_5b8._8_8_ - ((long)local_5b8._8_8_ >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)local_5b8._8_8_) {
          lVar15 = 0;
          do {
            pdVar2 = (PointerType)(uVar6 + lVar15 * 8);
            dVar5 = pdVar2[1];
            *(double *)(local_5b8._0_8_ + lVar15 * 8) = *pdVar2;
            ((double *)(local_5b8._0_8_ + lVar15 * 8))[1] = dVar5;
            lVar15 = lVar15 + 2;
          } while (lVar15 < (long)pdVar13);
        }
        if ((long)pdVar13 < (long)local_5b8._8_8_) {
          do {
            *(double *)(local_5b8._0_8_ + (long)pdVar13 * 8) = *(PointerType)(uVar6 + pdVar13 * 8);
            pdVar13 = (PointerType)((long)pdVar13 + 1);
          } while ((PointerType)local_5b8._8_8_ != pdVar13);
        }
        *(undefined ***)
         tVar8.
         super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
         .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl = local_470;
        *(undefined8 *)
         ((long)tVar8.
                super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 8) =
             local_5b8._0_8_;
        *(undefined8 *)
         ((long)tVar8.
                super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 0x10) =
             local_5b8._8_8_;
        local_658._0_8_ =
             tVar8.
             super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  (local_680,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_658);
        if ((_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             )local_658._0_8_ != (Geometry *)0x0) {
          (**(code **)(*(long *)local_658._0_8_ + 0x58))();
        }
        local_658._0_8_ = (_Head_base<0UL,_lf::geometry::Geometry_*,_false>)0x0;
        pdVar14 = (double *)local_3d8._0_8_;
      }
      free(pdVar14);
      free(local_678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      uVar12 = local_450 + 1;
    } while (uVar12 != local_458);
  }
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
             *)&local_518);
  return (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          *)local_680;
}

Assistant:

std::vector<std::unique_ptr<Geometry>> TriaO2::ChildGeometry(
    const RefinementPattern& ref_pat, lf::base::dim_t codim) const {
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kTria(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  LF_VERIFY_MSG(codim < 3, "Illegal codim " << codim);

  const double hLattice = 1. / static_cast<double>(ref_pat.LatticeConst());
  std::vector<std::unique_ptr<Geometry>> childGeoPtrs = {};

  // get coordinates of childGeometries
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>> childPolygons(
      ref_pat.ChildPolygons(codim));

  const base::size_type noChildren = childPolygons.size();
  LF_VERIFY_MSG(
      noChildren == ref_pat.NumChildren(codim),
      "NumChildren " << noChildren << " <-> " << ref_pat.NumChildren(codim));

  // create a geometry object for each child
  for (size_t child = 0; child < noChildren; ++child) {
    // codim == 0: a child triangle is described by a lattice polygon with six
    // vertices
    // codim == 1: a child segment is described by a polygon with three vertices
    // codim == 2: a child point by a single point ("polygon with one corner")
    LF_VERIFY_MSG(
        childPolygons[child].rows() == 2,
        "childPolygons[child].rows() = " << childPolygons[child].rows());
    LF_VERIFY_MSG(
        childPolygons[child].cols() == (3 - codim),
        "childPolygons[child].cols() = " << childPolygons[child].cols());

    const Eigen::MatrixXd locChildPolygonCoords(
        hLattice * childPolygons[child].cast<double>());

    switch (codim) {
      case 0: {
        Eigen::MatrixXd locChildCoords(locChildPolygonCoords.rows(), 6);
        locChildCoords << locChildPolygonCoords,
            (locChildPolygonCoords.col(0) + locChildPolygonCoords.col(1)) / 2.,
            (locChildPolygonCoords.col(1) + locChildPolygonCoords.col(2)) / 2.,
            (locChildPolygonCoords.col(2) + locChildPolygonCoords.col(0)) / 2.;

        childGeoPtrs.push_back(
            std::make_unique<TriaO2>(Global(locChildCoords)));

        break;
      }
      case 1: {
        Eigen::MatrixXd locChildCoords(locChildPolygonCoords.rows(), 3);
        locChildCoords << locChildPolygonCoords,
            (locChildPolygonCoords.col(0) + locChildPolygonCoords.col(1)) / 2.;

        childGeoPtrs.push_back(
            std::make_unique<SegmentO2>(Global(locChildCoords)));

        break;
      }
      case 2: {
        childGeoPtrs.push_back(
            std::make_unique<Point>(Global(locChildPolygonCoords)));

        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal co-dimension");
      }
    }
  }

  return childGeoPtrs;
}